

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::checkFixedFacet
          (TraverseSchema *this,DOMElement *elem,XMLCh *facetName,DatatypeValidator *baseDV,
          uint *flags)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  short *psVar8;
  XMLCh *pXVar9;
  uint uVar10;
  long lVar11;
  XMLCh *pXVar12;
  long *plVar7;
  
  iVar6 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,&SchemaSymbols::fgATT_FIXED);
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  if (plVar7 == (long *)0x0) {
    psVar8 = (short *)0x0;
  }
  else {
    psVar8 = (short *)(**(code **)(*plVar7 + 0x150))(plVar7);
  }
  if (psVar8 == (short *)0x0) {
    return;
  }
  if (*psVar8 == 0) {
    return;
  }
  if (psVar8 != &SchemaSymbols::fgATTVAL_TRUE) {
    lVar11 = 0;
    do {
      psVar1 = (short *)((long)psVar8 + lVar11);
      if (*psVar1 == 0) {
        if ((psVar8 == &fgValueOne) ||
           (*(short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar11) == 0)) goto LAB_00339f7f;
        goto LAB_00339f50;
      }
      psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar11);
      lVar11 = lVar11 + 2;
    } while (*psVar1 == *psVar2);
    if (psVar8 != &fgValueOne) {
LAB_00339f50:
      lVar11 = 0;
      while (psVar1 = (short *)((long)psVar8 + lVar11), *psVar1 != 0) {
        psVar2 = (short *)((long)&fgValueOne + lVar11);
        lVar11 = lVar11 + 2;
        if (*psVar1 != *psVar2) {
          return;
        }
      }
      if (*(short *)((long)&fgValueOne + lVar11) != 0) {
        return;
      }
    }
  }
LAB_00339f7f:
  if (facetName == L"length") {
LAB_00339fbe:
    *(byte *)flags = (byte)*flags | 1;
  }
  else if (facetName == (XMLCh *)0x0) {
    pXVar9 = L"length";
LAB_00339fb8:
    if (*pXVar9 == L'\0') goto LAB_00339fbe;
  }
  else {
    pXVar12 = L"length";
    pXVar9 = facetName;
    do {
      XVar3 = *pXVar12;
      if (XVar3 == L'\0') goto LAB_00339fb8;
      pXVar12 = pXVar12 + 1;
      XVar4 = *pXVar9;
      pXVar9 = pXVar9 + 1;
    } while (XVar3 == XVar4);
  }
  uVar10 = 2;
  if (facetName != L"minLength") {
    if (facetName == (XMLCh *)0x0) {
      pXVar9 = L"minLength";
LAB_0033a003:
      if (*pXVar9 == L'\0') goto LAB_0033a14d;
    }
    else {
      pXVar12 = L"minLength";
      pXVar9 = facetName;
      do {
        XVar3 = *pXVar12;
        if (XVar3 == L'\0') goto LAB_0033a003;
        pXVar12 = pXVar12 + 1;
        XVar4 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar3 == XVar4);
    }
    uVar10 = 4;
    if (facetName != L"maxLength") {
      if (facetName == (XMLCh *)0x0) {
        pXVar9 = L"maxLength";
LAB_0033a04f:
        if (*pXVar9 == L'\0') goto LAB_0033a14d;
      }
      else {
        pXVar12 = L"maxLength";
        pXVar9 = facetName;
        do {
          XVar3 = *pXVar12;
          if (XVar3 == L'\0') goto LAB_0033a04f;
          pXVar12 = pXVar12 + 1;
          XVar4 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar3 == XVar4);
      }
      uVar10 = 0x40;
      if (facetName != L"maxExclusive") {
        if (facetName == (XMLCh *)0x0) {
          pXVar9 = L"maxExclusive";
LAB_0033a09b:
          if (*pXVar9 == L'\0') goto LAB_0033a14d;
        }
        else {
          pXVar12 = L"maxExclusive";
          pXVar9 = facetName;
          do {
            XVar3 = *pXVar12;
            if (XVar3 == L'\0') goto LAB_0033a09b;
            pXVar12 = pXVar12 + 1;
            XVar4 = *pXVar9;
            pXVar9 = pXVar9 + 1;
          } while (XVar3 == XVar4);
        }
        uVar10 = 0x20;
        if (facetName != L"maxInclusive") {
          if (facetName == (XMLCh *)0x0) {
            pXVar9 = L"maxInclusive";
LAB_0033a0e7:
            if (*pXVar9 == L'\0') goto LAB_0033a14d;
          }
          else {
            pXVar12 = L"maxInclusive";
            pXVar9 = facetName;
            do {
              XVar3 = *pXVar12;
              if (XVar3 == L'\0') goto LAB_0033a0e7;
              pXVar12 = pXVar12 + 1;
              XVar4 = *pXVar9;
              pXVar9 = pXVar9 + 1;
            } while (XVar3 == XVar4);
          }
          bVar5 = XMLString::equals(L"minExclusive",facetName);
          uVar10 = 0x100;
          if (!bVar5) {
            bVar5 = XMLString::equals(L"minInclusive",facetName);
            uVar10 = 0x80;
            if (!bVar5) {
              bVar5 = XMLString::equals(L"totalDigits",facetName);
              uVar10 = 0x200;
              if (!bVar5) {
                bVar5 = XMLString::equals(L"fractionDigits",facetName);
                uVar10 = 0x400;
                if (!bVar5) {
                  bVar5 = XMLString::equals(L"whiteSpace",facetName);
                  if (!bVar5) {
                    return;
                  }
                  if (baseDV->fType != String) {
                    return;
                  }
                  uVar10 = 0x4000;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0033a14d:
  *flags = *flags | uVar10;
  return;
}

Assistant:

void TraverseSchema::checkFixedFacet(const DOMElement* const elem,
                                     const XMLCh* const facetName,
                                     const DatatypeValidator* const baseDV,
                                     unsigned int& flags)
{
    const XMLCh* fixedFacet = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);

    if ((fixedFacet && *fixedFacet) &&
        (XMLString::equals(fixedFacet, SchemaSymbols::fgATTVAL_TRUE)
         || XMLString::equals(fixedFacet, fgValueOne))) {

        if (XMLString::equals(SchemaSymbols::fgELT_LENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_LENGTH;
        }
        if (XMLString::equals(SchemaSymbols::fgELT_MINLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MINLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MAXLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXINCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXINCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MINEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MINEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MININCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MININCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_TOTALDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_TOTALDIGITS;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_FRACTIONDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_FRACTIONDIGITS;
        }
        else if ((XMLString::equals(SchemaSymbols::fgELT_WHITESPACE, facetName)) &&
                 baseDV->getType() == DatatypeValidator::String) {
            flags |= DatatypeValidator::FACET_WHITESPACE;
        }
    }
}